

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O1

size_t menu_dynamic_longest_entry(menu_conflict *m)

{
  size_t sVar1;
  ulong uVar2;
  undefined8 *puVar3;
  
  uVar2 = 0;
  for (puVar3 = (undefined8 *)m->menu_data; puVar3 != (undefined8 *)0x0;
      puVar3 = (undefined8 *)puVar3[2]) {
    sVar1 = strlen((char *)*puVar3);
    if (uVar2 < sVar1) {
      uVar2 = sVar1;
    }
  }
  return uVar2;
}

Assistant:

size_t menu_dynamic_longest_entry(struct menu *m)
{
	size_t biggest = 0;
	size_t current;

	struct menu_entry *entry;

	for (entry = menu_priv(m); entry; entry = entry->next) {
		current = strlen(entry->text);
		if (current > biggest)
			biggest = current;
	}

	return biggest;
}